

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClearActiveID(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  bVar2 = GImGui->ActiveId != 0;
  GImGui->ActiveIdIsJustActivated = bVar2;
  if (bVar2) {
    pIVar1->ActiveIdTimer = 0.0;
    pIVar1->ActiveIdHasBeenPressedBefore = false;
    pIVar1->ActiveIdHasBeenEditedBefore = false;
    pIVar1->ActiveIdMouseButton = -1;
  }
  pIVar1->ActiveId = 0;
  pIVar1->ActiveIdAllowOverlap = false;
  pIVar1->ActiveIdNoClearOnFocusLoss = false;
  pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
  pIVar1->ActiveIdHasBeenEditedThisFrame = false;
  pIVar1->ActiveIdUsingMouseWheel = false;
  pIVar1->ActiveIdUsingNavDirMask = 0;
  pIVar1->ActiveIdUsingNavInputMask = 0;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[0] = 0;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[1] = 0;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[1] = 0;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[2] = 0;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[3] = 0;
  (pIVar1->ActiveIdUsingKeyInputMask).Storage[4] = 0;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    if (g.ActiveIdIsJustActivated)
    {
        g.ActiveIdTimer = 0.0f;
        g.ActiveIdHasBeenPressedBefore = false;
        g.ActiveIdHasBeenEditedBefore = false;
        g.ActiveIdMouseButton = -1;
        if (id != 0)
        {
            g.LastActiveId = id;
            g.LastActiveIdTimer = 0.0f;
        }
    }
    g.ActiveId = id;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdNoClearOnFocusLoss = false;
    g.ActiveIdWindow = window;
    g.ActiveIdHasBeenEditedThisFrame = false;
    if (id)
    {
        g.ActiveIdIsAlive = id;
        g.ActiveIdSource = (g.NavActivateId == id || g.NavActivateInputId == id || g.NavJustMovedToId == id) ? (ImGuiInputSource)ImGuiInputSource_Nav : ImGuiInputSource_Mouse;
    }

    // Clear declaration of inputs claimed by the widget
    // (Please note that this is WIP and not all keys/inputs are thoroughly declared by all widgets yet)
    g.ActiveIdUsingMouseWheel = false;
    g.ActiveIdUsingNavDirMask = 0x00;
    g.ActiveIdUsingNavInputMask = 0x00;
    g.ActiveIdUsingKeyInputMask.ClearAllBits();
}